

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSLogger.cpp
# Opt level: O0

double __thiscall PSLogger::log(PSLogger *this,double __x)

{
  ostream *poVar1;
  string *in_RCX;
  string *in_RDX;
  int in_ESI;
  allocator<char> local_49;
  string local_48 [8];
  string enum_str;
  string *p_msg_local;
  string *p_category_local;
  LogType p_type_local;
  PSLogger *this_local;
  
  if ((int)this->log_verbosity <= in_ESI) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,"",&local_49);
    std::allocator<char>::~allocator(&local_49);
    switch(in_ESI) {
    case 0:
      std::__cxx11::string::operator=(local_48,"None");
      break;
    case 1:
      std::__cxx11::string::operator=(local_48,"VerboseLog");
      break;
    case 2:
      std::__cxx11::string::operator=(local_48,"Log");
      break;
    case 3:
      std::__cxx11::string::operator=(local_48,"Warning");
      break;
    case 4:
      std::__cxx11::string::operator=(local_48,"Error");
      break;
    case 5:
      std::__cxx11::string::operator=(local_48,"Critical");
      break;
    default:
      std::__cxx11::string::operator=(local_48,"UNKNOWN LOGTYPE");
    }
    poVar1 = std::operator<<((ostream *)&std::cout,local_48);
    poVar1 = std::operator<<(poVar1," : ");
    poVar1 = std::operator<<(poVar1,in_RDX);
    poVar1 = std::operator<<(poVar1," : ");
    poVar1 = std::operator<<(poVar1,in_RCX);
    std::operator<<(poVar1,"\n");
    __x = (double)std::__cxx11::string::~string(local_48);
  }
  return __x;
}

Assistant:

void PSLogger::log(LogType p_type, std::string p_category, std::string p_msg)
{
    if(p_type < log_verbosity )
    {
        return;
    }

    std::string enum_str = "";
    switch(p_type)
    {
    case LogType::None:
    enum_str = "None";
        break;
    case LogType::VerboseLog:
    enum_str = "VerboseLog";
        break;
    case LogType::Log:
    enum_str = "Log";
        break;
    case LogType::Warning:
    enum_str = "Warning";
        break;
    case LogType::Error:
    enum_str = "Error";
        break;
    case LogType::Critical:
    enum_str = "Critical";
        break;
    default:
    enum_str = "UNKNOWN LOGTYPE";
        break;
    }

    std::cout << enum_str << " : " << p_category << " : " << p_msg << "\n";
}